

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O1

SuffixImpl * __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name,int kind,int num_values,
          SuffixTable *table)

{
  size_t __n;
  _Rb_tree_iterator<mp::internal::SuffixBase::Impl> _Var1;
  char *__s;
  _Base_ptr p_Var2;
  Error *this_00;
  pair<std::_Rb_tree_iterator<mp::internal::SuffixBase::Impl>,_bool> pVar3;
  BasicStringRef<char> local_a0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_a0.size_ = name.size_;
  local_a0.data_ = name.data_;
  local_88 = 0;
  local_80 = 0;
  local_70._20_4_ = 0;
  local_70._24_8_ = (void *)0x0;
  local_90 = &local_80;
  local_70._0_8_ = local_a0.data_;
  local_70._8_8_ = local_a0.size_;
  local_70._16_4_ = kind;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,&local_80,&local_80);
  pVar3 = std::
          _Rb_tree<mp::internal::SuffixBase::Impl,_mp::internal::SuffixBase::Impl,_std::_Identity<mp::internal::SuffixBase::Impl>,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
          ::_M_insert_unique<mp::internal::SuffixBase::Impl>(&(this->set_)._M_t,(Impl *)local_70);
  _Var1 = pVar3.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  __n = local_a0.size_;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *(undefined8 *)(_Var1._M_node + 1) = 0;
    _Var1._M_node[1]._M_parent = (_Base_ptr)0x0;
    if (-1 < (long)(local_a0.size_ + 1)) {
      __s = (char *)operator_new(local_a0.size_ + 1);
      if (__n != 0) {
        memmove(__s,local_a0.data_,__n);
      }
      __s[__n] = '\0';
      p_Var2 = (_Base_ptr)strlen(__s);
      *(char **)(_Var1._M_node + 1) = __s;
      _Var1._M_node[1]._M_parent = p_Var2;
      *(int *)((long)&_Var1._M_node[1]._M_left + 4) = num_values;
      std::__cxx11::string::_M_assign((string *)(_Var1._M_node + 2));
      return (SuffixImpl *)(_Var1._M_node + 1);
    }
    std::__throw_bad_alloc();
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error<fmt::BasicStringRef<char>>(this_00,(CStringRef)0x3831d5,&local_a0);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

typename BasicSuffixSet<Alloc>::SuffixImpl *BasicSuffixSet<Alloc>::DoAdd(
    fmt::StringRef name, int kind, int num_values,
    const SuffixTable& table) {
  std::pair<typename Set::iterator, bool> result =
      set_.insert(Suffix::Impl(name, kind));
  if (!result.second)
    throw Error("duplicate suffix '{}'", name);
  Suffix::Impl *impl = const_cast<SuffixImpl*>(&*result.first);
  /// Set name to empty string so that it is not deleted if new throws.
  std::size_t size = name.size();
  impl->name = fmt::StringRef(0, 0);
  char *name_copy = Allocate<char>(size + 1);
  const char *s = name.data();
  std::copy(s, s + size, fmt::internal::make_ptr(name_copy, size));
  name_copy[size] = 0;
  impl->name = name_copy;
  impl->num_values = num_values;
  impl->table = table;
  return impl;
}